

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.cpp
# Opt level: O0

void __thiscall ValidateFootprint::CheckIntensityBins(ValidateFootprint *this)

{
  bool bVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  int *local_28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  ValidateFootprint *local_10;
  ValidateFootprint *this_local;
  
  local_10 = this;
  local_20._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(&this->intensityBinIDs_);
  local_28 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->intensityBinIDs_);
  local_18 = std::find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                       (local_20,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                                 local_28,&(this->fr_).super_EventRow.intensity_bin_id);
  local_30._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(&this->intensityBinIDs_);
  bVar1 = __gnu_cxx::operator==(&local_18,&local_30);
  if (bVar1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->intensityBinIDs_,&(this->fr_).super_EventRow.intensity_bin_id);
  }
  else {
    fprintf(_stderr,
            "ERROR: Duplicate intensity bin %d on line %d for event ID %d areaperil ID %u:\n%s\n",
            (ulong)(uint)(this->fr_).super_EventRow.intensity_bin_id,
            (ulong)(uint)(this->super_Validate).lineno_,(ulong)(uint)(this->fr_).event_id,
            (ulong)(this->fr_).super_EventRow.areaperil_id,&this->super_Validate);
    Validate::PrintErrorMessage(&this->super_Validate);
  }
  return;
}

Assistant:

inline void ValidateFootprint::CheckIntensityBins() {

  if (find(intensityBinIDs_.begin(), intensityBinIDs_.end(),
           fr_.intensity_bin_id) == intensityBinIDs_.end()) {

    intensityBinIDs_.push_back(fr_.intensity_bin_id);

    return;

  }

  fprintf(stderr, "ERROR: Duplicate intensity bin %d on line %d"
		  " for event ID %d areaperil ID %u:\n%s\n",
	  fr_.intensity_bin_id, lineno_, fr_.event_id, fr_.areaperil_id, line_);
  PrintErrorMessage();

}